

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O1

void __thiscall OpenMD::RigidBody::addAtom(RigidBody *this,Atom *at,AtomStamp *ats)

{
  pointer *pppAVar1;
  double *pdVar2;
  iterator __position;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  double (*padVar6) [3];
  uint i;
  long lVar7;
  long lVar8;
  value_type *__x;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  double dVar9;
  double __x_00;
  Vector3d coords;
  SquareMatrix<double,_3> m;
  RotMat3x3d identMat;
  Atom *local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  value_type local_d8;
  value_type local_b8;
  value_type local_70;
  
  local_d8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_d8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_d8.super_Vector<double,_3U>.data_[2] = 0.0;
  __position._M_current =
       (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_130 = at;
  if (__position._M_current ==
      (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>::_M_realloc_insert<OpenMD::Atom*const&>
              ((vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>> *)&this->atoms_,__position,
               &local_130);
  }
  else {
    *__position._M_current = at;
    pppAVar1 = &(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  if (ats->havePos_ == false) {
    pdVar2 = local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2;
    pcVar3 = (ats->Type).data_._M_dataplus._M_p;
    local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)pdVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + (ats->Type).data_._M_string_length);
    snprintf(painCave.errMsg,2000,
             "RigidBody error.\n\tAtom %s does not have a position specified.\n\tThis means RigidBody cannot set up reference coordinates.\n"
            );
    if ((double *)
        local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] !=
        pdVar2) {
      operator_delete((void *)local_70.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][0],
                      (long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                            data_[0][2] + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  local_d8.super_Vector<double,_3U>.data_[0] = (ats->position_).super_Vector<double,_3U>.data_[0];
  local_d8.super_Vector<double,_3U>.data_[1] = (ats->position_).super_Vector<double,_3U>.data_[1];
  local_d8.super_Vector<double,_3U>.data_[2] = (ats->position_).super_Vector<double,_3U>.data_[2];
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&this->refCoords_,&local_d8);
  padVar6 = (double (*) [3])&local_b8;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      dVar9 = 1.0;
      if (lVar7 != lVar8) {
        dVar9 = 0.0;
      }
      (((SquareMatrix<double,_3> *)*padVar6)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar8] =
           dVar9;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar7 = lVar7 + 1;
    padVar6 = padVar6 + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    *(undefined8 *)
     ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar7 + 0x10) =
         *(undefined8 *)
          ((long)local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar7 + 0x10);
    uVar4 = *(undefined8 *)
             ((long)local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
             + lVar7 + 8);
    *(undefined8 *)
     ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar7
     ) = *(undefined8 *)
          ((long)local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar7);
    *(undefined8 *)
     ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar7 + 8) = uVar4;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  bVar5 = AtomType::isDirectional(local_130->atomType_);
  if (bVar5) {
    if (ats->haveOrt_ == false) {
      pdVar2 = local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2;
      pcVar3 = (ats->Type).data_._M_dataplus._M_p;
      local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           (double)pdVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar3,pcVar3 + (ats->Type).data_._M_string_length);
      snprintf(painCave.errMsg,2000,
               "RigidBody error.\n\tAtom %s does not have an orientation specified.\n\tThis means RigidBody cannot set up reference orientations.\n"
               ,local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0])
      ;
      if ((double *)
          local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] !=
          pdVar2) {
        operator_delete((void *)local_b8.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][0],
                        (long)local_b8.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][2] + 1);
      }
      painCave.isFatal = 1;
      simError();
    }
    local_118._0_8_ =
         ((ats->orientation_).super_Vector<double,_3U>.data_[0] * 3.141592653589793) / 180.0;
    local_128._0_8_ =
         ((ats->orientation_).super_Vector<double,_3U>.data_[1] * 3.141592653589793) / 180.0;
    __x_00 = ((ats->orientation_).super_Vector<double,_3U>.data_[2] * 3.141592653589793) / 180.0;
    __x = &local_b8;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    dVar9 = sin((double)local_118._0_8_);
    local_f8._8_4_ = extraout_XMM0_Dc;
    local_f8._0_8_ = dVar9;
    local_f8._12_4_ = extraout_XMM0_Dd;
    dVar9 = sin((double)local_128._0_8_);
    local_e8._8_4_ = extraout_XMM0_Dc_00;
    local_e8._0_8_ = dVar9;
    local_e8._12_4_ = extraout_XMM0_Dd_00;
    dVar9 = sin(__x_00);
    local_108._8_4_ = extraout_XMM0_Dc_01;
    local_108._0_8_ = dVar9;
    local_108._12_4_ = extraout_XMM0_Dd_01;
    dVar9 = cos((double)local_118._0_8_);
    local_118._8_4_ = extraout_XMM0_Dc_02;
    local_118._0_8_ = dVar9;
    local_118._12_4_ = extraout_XMM0_Dd_02;
    dVar9 = cos((double)local_128._0_8_);
    local_128._8_4_ = extraout_XMM0_Dc_03;
    local_128._0_8_ = dVar9;
    local_128._12_4_ = extraout_XMM0_Dd_03;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
         cos(__x_00);
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
         (double)local_e8._0_8_ * (double)local_108._0_8_;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
         (double)local_118._0_8_ +
         (double)local_108._0_8_ * -(double)local_128._0_8_ * (double)local_f8._0_8_;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
         local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
         (double)local_f8._0_8_ +
         (double)local_108._0_8_ * (double)local_128._0_8_ * (double)local_118._0_8_;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
         local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
         -(double)local_128._0_8_ * (double)local_f8._0_8_ -
         (double)local_118._0_8_ * (double)local_108._0_8_;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
         local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
         (double)local_128._0_8_ * (double)local_118._0_8_ -
         (double)local_f8._0_8_ * (double)local_108._0_8_;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
         (double)local_e8._0_8_ *
         local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
         (double)local_e8._0_8_ * (double)local_f8._0_8_;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
         -(double)local_e8._0_8_ * (double)local_118._0_8_;
    local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
         (double)local_128._0_8_;
  }
  else {
    __x = &local_70;
  }
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  push_back(&this->refOrients_,__x);
  return;
}

Assistant:

void RigidBody::addAtom(Atom* at, AtomStamp* ats) {
    Vector3d coords;
    Vector3d euler;

    atoms_.push_back(at);

    if (!ats->havePosition()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RigidBody error.\n"
               "\tAtom %s does not have a position specified.\n"
               "\tThis means RigidBody cannot set up reference coordinates.\n",
               ats->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    coords[0] = ats->getPosX();
    coords[1] = ats->getPosY();
    coords[2] = ats->getPosZ();

    refCoords_.push_back(coords);

    RotMat3x3d identMat = RotMat3x3d::identity();

    if (at->isDirectional()) {
      if (!ats->haveOrientation()) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "RigidBody error.\n"
            "\tAtom %s does not have an orientation specified.\n"
            "\tThis means RigidBody cannot set up reference orientations.\n",
            ats->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }

      euler[0] = ats->getEulerPhi() * Constants::PI / 180.0;
      euler[1] = ats->getEulerTheta() * Constants::PI / 180.0;
      euler[2] = ats->getEulerPsi() * Constants::PI / 180.0;

      RotMat3x3d Atmp(euler);
      refOrients_.push_back(Atmp);

    } else {
      refOrients_.push_back(identMat);
    }
  }